

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O1

int __thiscall llvm::StringRef::compare_numeric(StringRef *this,StringRef RHS)

{
  byte bVar1;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  char cVar13;
  ulong uVar14;
  uint unaff_R14D;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  
  uVar7 = RHS.Length;
  pcVar10 = RHS.Data;
  uVar2 = this->Length;
  uVar11 = uVar7;
  if (uVar2 < uVar7) {
    uVar11 = uVar2;
  }
  bVar18 = uVar11 == 0;
  if (!bVar18) {
    pcVar3 = this->Data;
    uVar15 = 0;
    do {
      bVar1 = pcVar3[uVar15];
      if (((byte)(bVar1 - 0x30) < 10) && ((byte)(pcVar10[uVar15] - 0x30U) < 10)) {
        lVar5 = 0;
        pcVar8 = pcVar10;
        pcVar12 = pcVar3;
        do {
          pcVar12 = pcVar12 + 1;
          pcVar8 = pcVar8 + 1;
          lVar9 = uVar11 + 1;
          uVar14 = uVar11;
          if ((uVar15 - uVar11) + lVar5 == 0) goto LAB_00db9d9f;
          uVar14 = uVar15 + lVar5 + 1;
          bVar16 = false;
          if (uVar14 < uVar2) {
            bVar16 = (byte)(pcVar12[uVar15] - 0x30U) < 10;
          }
          if (uVar14 < uVar7) {
            bVar17 = (byte)(pcVar8[uVar15] - 0x30U) < 10;
          }
          else {
            bVar17 = false;
          }
          cVar13 = (bVar17 ^ 1U) * '\x05';
          if (bVar16 != bVar17) {
            cVar13 = '\x01';
            unaff_R14D = -(uint)bVar17 | 1;
          }
          lVar5 = lVar5 + 1;
        } while (cVar13 == '\0');
        if (cVar13 == '\x05') {
          lVar9 = uVar15 + lVar5;
          uVar14 = (uVar15 + lVar5) - 1;
LAB_00db9d9f:
          iVar4 = 0;
          if (lVar9 - uVar15 != 0) {
            iVar4 = memcmp(pcVar3 + uVar15,pcVar10 + uVar15,lVar9 - uVar15);
          }
          uVar6 = iVar4 >> 0x1f | 1;
          bVar16 = iVar4 == 0;
          if (bVar16) {
            uVar15 = uVar14;
            uVar6 = unaff_R14D;
          }
        }
        else {
          bVar16 = false;
          uVar6 = unaff_R14D;
        }
        unaff_R14D = uVar6;
        if (!bVar16) break;
      }
      else if (bVar1 != pcVar10[uVar15]) {
        unaff_R14D = -(uint)(bVar1 < (byte)pcVar10[uVar15]) | 1;
        break;
      }
      uVar15 = uVar15 + 1;
      bVar18 = uVar15 == uVar11;
    } while (!bVar18);
  }
  if ((bVar18) && (unaff_R14D = 0, uVar2 != uVar7)) {
    unaff_R14D = -(uint)(uVar2 < uVar7) | 1;
  }
  return unaff_R14D;
}

Assistant:

int StringRef::compare_numeric(StringRef RHS) const {
  for (size_t I = 0, E = std::min(Length, RHS.Length); I != E; ++I) {
    // Check for sequences of digits.
    if (isDigit(Data[I]) && isDigit(RHS.Data[I])) {
      // The longer sequence of numbers is considered larger.
      // This doesn't really handle prefixed zeros well.
      size_t J;
      for (J = I + 1; J != E + 1; ++J) {
        bool ld = J < Length && isDigit(Data[J]);
        bool rd = J < RHS.Length && isDigit(RHS.Data[J]);
        if (ld != rd)
          return rd ? -1 : 1;
        if (!rd)
          break;
      }
      // The two number sequences have the same length (J-I), just memcmp them.
      if (int Res = compareMemory(Data + I, RHS.Data + I, J - I))
        return Res < 0 ? -1 : 1;
      // Identical number sequences, continue search after the numbers.
      I = J - 1;
      continue;
    }
    if (Data[I] != RHS.Data[I])
      return (unsigned char)Data[I] < (unsigned char)RHS.Data[I] ? -1 : 1;
  }
  if (Length == RHS.Length)
    return 0;
  return Length < RHS.Length ? -1 : 1;
}